

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,RegexFlags *flags)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  RegexFlags RVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  ThreadConfiguration *pTVar8;
  EncodedChar *pEVar7;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pbVar6 = this->next;
  do {
    if (this->inputLim < pbVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) {
LAB_00ece17a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      pbVar6 = this->next;
    }
    bVar1 = *pbVar6;
    if (bVar1 == 0) {
      return;
    }
    switch(bVar1 - 0x67 >> 1 | (uint)((bVar1 - 0x67 & 1) != 0) << 0x1f) {
    case 0:
      RVar4 = *flags;
      if ((RVar4 & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | GlobalRegexFlag;
      break;
    case 1:
      RVar4 = *flags;
      if ((RVar4 & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | IgnoreCaseRegexFlag;
      break;
    default:
      goto switchD_00ecdfb9_caseD_2;
    case 3:
      RVar4 = *flags;
      if ((RVar4 & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | MultilineRegexFlag;
      break;
    case 6:
      pTVar8 = (this->scriptContext->config).threadConfig;
      if (pTVar8->m_ES2018RegExDotAll != true) goto LAB_00ece059;
      RVar4 = *flags;
      if ((RVar4 & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | DotAllRegexFlag;
      break;
    case 7:
      pTVar8 = (this->scriptContext->config).threadConfig;
LAB_00ece059:
      if (pTVar8->m_ES6Unicode != true) goto LAB_00ece07a;
      RVar4 = *flags;
      if ((RVar4 & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | UnicodeRegexFlag;
      break;
    case 9:
      pTVar8 = (this->scriptContext->config).threadConfig;
LAB_00ece07a:
      if (pTVar8->m_ES6RegExSticky != true) {
switchD_00ecdfb9_caseD_2:
        if ((ASCIIChars::classes[bVar1] & 1) == 0) {
          return;
        }
        Fail(this,-0x7ff5ec67);
        return;
      }
      RVar4 = *flags;
      if ((RVar4 & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | StickyRegexFlag;
    }
    *flags = RVar4;
    pEVar7 = this->next;
    if (this->inputLim < pEVar7 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ece17a;
      *puVar5 = 0;
      pEVar7 = this->next;
    }
    if ((char)*pEVar7 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar3) goto LAB_00ece17a;
      *puVar5 = 0;
      pEVar7 = this->next;
    }
    pbVar6 = pEVar7 + 1;
    this->next = pbVar6;
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }